

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O3

int log_aspect_attach(log_aspect aspect,log_policy policy)

{
  ulong uVar1;
  int iVar2;
  log_policy *pplVar3;
  size_t sVar4;
  
  if ((aspect->restrict_cb != (log_aspect_restrict_cb)0x0) &&
     (iVar2 = (*aspect->restrict_cb)(aspect,policy), iVar2 != 0)) {
    return 1;
  }
  uVar1 = aspect->size;
  if (uVar1 <= aspect->count + 1) {
    if (0xff < uVar1) {
      return 1;
    }
    sVar4 = 0x100;
    if (0xfffffffffffffeff < uVar1 * 2 - 0x101) {
      sVar4 = uVar1 * 2;
    }
    pplVar3 = (log_policy *)realloc(aspect->policies,sVar4 * 8);
    if (pplVar3 == (log_policy *)0x0) {
      return 1;
    }
    aspect->policies = pplVar3;
    aspect->size = sVar4;
  }
  log_policy_classify(policy,aspect);
  sVar4 = aspect->count;
  aspect->policies[sVar4] = policy;
  aspect->count = sVar4 + 1;
  return 0;
}

Assistant:

int log_aspect_attach(log_aspect aspect, log_policy policy)
{
	if (aspect->restrict_cb != NULL && aspect->restrict_cb(aspect, policy) != 0)
	{
		return 1;
	}

	if ((aspect->count + 1) >= aspect->size)
	{
		register void *data;

		size_t size = 0;

		if (aspect->size >= LOG_ASPECT_POLICIES_MAX_SIZE)
		{
			return 1;
		}

		size = aspect->size << 0x01;

		if ((size - 1) >= LOG_ASPECT_POLICIES_MAX_SIZE)
		{
			size = LOG_ASPECT_POLICIES_MAX_SIZE;
		}

		data = realloc(aspect->policies, sizeof(log_policy) * size);

		if (data == NULL)
		{
			return 1;
		}

		aspect->policies = data;

		aspect->size = size;
	}

	log_policy_classify(policy, aspect);

	aspect->policies[aspect->count] = policy;

	++aspect->count;

	return 0;
}